

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocker.cc
# Opt level: O0

void __thiscall
webrtc::Blocker::ProcessChunk
          (Blocker *this,float **input,size_t chunk_size,size_t num_input_channels,
          size_t num_output_channels,float **output)

{
  size_t sVar1;
  size_t sVar2;
  BlockerCallback *pBVar3;
  size_t sVar4;
  float **ppfVar5;
  pointer pfVar6;
  float **ppfVar7;
  float **result;
  ulong local_4d0;
  size_t first_frame_in_block;
  string *local_350;
  string *_result_2;
  string *local_1d0;
  string *_result_1;
  FatalMessage local_1b8;
  string *local_40;
  string *_result;
  float **output_local;
  size_t num_output_channels_local;
  size_t num_input_channels_local;
  size_t chunk_size_local;
  float **input_local;
  Blocker *this_local;
  
  _result = (string *)output;
  output_local = (float **)num_output_channels;
  num_output_channels_local = num_input_channels;
  num_input_channels_local = chunk_size;
  chunk_size_local = (size_t)input;
  input_local = (float **)this;
  local_40 = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                       (&num_input_channels_local,&this->chunk_size_,"chunk_size == chunk_size_");
  if (local_40 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&local_1b8,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/blocker.cc"
               ,0xac,local_40);
    rtc::FatalMessage::stream(&local_1b8);
    rtc::FatalMessage::~FatalMessage(&local_1b8);
  }
  local_1d0 = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                        (&num_output_channels_local,&this->num_input_channels_,
                         "num_input_channels == num_input_channels_");
  if (local_1d0 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              ((FatalMessage *)&_result_2,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/blocker.cc"
               ,0xad,local_1d0);
    rtc::FatalMessage::stream((FatalMessage *)&_result_2);
    rtc::FatalMessage::~FatalMessage((FatalMessage *)&_result_2);
  }
  local_350 = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                        ((unsigned_long *)&output_local,&this->num_output_channels_,
                         "num_output_channels == num_output_channels_");
  if (local_350 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              ((FatalMessage *)&first_frame_in_block,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/blocker.cc"
               ,0xae,local_350);
    rtc::FatalMessage::stream((FatalMessage *)&first_frame_in_block);
    rtc::FatalMessage::~FatalMessage((FatalMessage *)&first_frame_in_block);
  }
  AudioRingBuffer::Write
            (&this->input_buffer_,(float **)chunk_size_local,num_output_channels_local,
             this->chunk_size_);
  for (local_4d0 = this->frame_offset_; local_4d0 < this->chunk_size_;
      local_4d0 = this->shift_amount_ + local_4d0) {
    ppfVar5 = ChannelBuffer<float>::channels(&this->input_block_);
    AudioRingBuffer::Read(&this->input_buffer_,ppfVar5,num_output_channels_local,this->block_size_);
    AudioRingBuffer::MoveReadPositionBackward
              (&this->input_buffer_,this->block_size_ - this->shift_amount_);
    pfVar6 = std::unique_ptr<float[],_std::default_delete<float[]>_>::get(&this->window_);
    sVar1 = this->block_size_;
    sVar2 = this->num_input_channels_;
    ppfVar5 = ChannelBuffer<float>::channels(&this->input_block_);
    anon_unknown.dwarf_3b8dc::ApplyWindow(pfVar6,sVar1,sVar2,ppfVar5);
    pBVar3 = this->callback_;
    ppfVar5 = ChannelBuffer<float>::channels(&this->input_block_);
    sVar1 = this->block_size_;
    sVar2 = this->num_input_channels_;
    sVar4 = this->num_output_channels_;
    ppfVar7 = ChannelBuffer<float>::channels(&this->output_block_);
    (*pBVar3->_vptr_BlockerCallback[2])(pBVar3,ppfVar5,sVar1,sVar2,sVar4,ppfVar7);
    pfVar6 = std::unique_ptr<float[],_std::default_delete<float[]>_>::get(&this->window_);
    sVar1 = this->block_size_;
    sVar2 = this->num_output_channels_;
    ppfVar5 = ChannelBuffer<float>::channels(&this->output_block_);
    anon_unknown.dwarf_3b8dc::ApplyWindow(pfVar6,sVar1,sVar2,ppfVar5);
    ppfVar5 = ChannelBuffer<float>::channels(&this->output_buffer_);
    ppfVar7 = ChannelBuffer<float>::channels(&this->output_block_);
    sVar1 = this->block_size_;
    sVar2 = this->num_output_channels_;
    result = ChannelBuffer<float>::channels(&this->output_buffer_);
    anon_unknown.dwarf_3b8dc::AddFrames(ppfVar5,local_4d0,ppfVar7,0,sVar1,sVar2,result,local_4d0);
  }
  ppfVar5 = ChannelBuffer<float>::channels(&this->output_buffer_);
  anon_unknown.dwarf_3b8dc::CopyFrames
            (ppfVar5,0,this->chunk_size_,this->num_output_channels_,(float **)_result,0);
  ppfVar5 = ChannelBuffer<float>::channels(&this->output_buffer_);
  sVar4 = num_input_channels_local;
  sVar1 = this->initial_delay_;
  sVar2 = this->num_output_channels_;
  ppfVar7 = ChannelBuffer<float>::channels(&this->output_buffer_);
  anon_unknown.dwarf_3b8dc::MoveFrames(ppfVar5,sVar4,sVar1,sVar2,ppfVar7,0);
  ppfVar5 = ChannelBuffer<float>::channels(&this->output_buffer_);
  anon_unknown.dwarf_3b8dc::ZeroOut
            (ppfVar5,this->initial_delay_,this->chunk_size_,this->num_output_channels_);
  this->frame_offset_ = local_4d0 - this->chunk_size_;
  return;
}

Assistant:

void Blocker::ProcessChunk(const float* const* input,
                           size_t chunk_size,
                           size_t num_input_channels,
                           size_t num_output_channels,
                           float* const* output) {
  RTC_CHECK_EQ(chunk_size, chunk_size_);
  RTC_CHECK_EQ(num_input_channels, num_input_channels_);
  RTC_CHECK_EQ(num_output_channels, num_output_channels_);

  input_buffer_.Write(input, num_input_channels, chunk_size_);
  size_t first_frame_in_block = frame_offset_;

  // Loop through blocks.
  while (first_frame_in_block < chunk_size_) {
    input_buffer_.Read(input_block_.channels(), num_input_channels,
                       block_size_);
    input_buffer_.MoveReadPositionBackward(block_size_ - shift_amount_);

    ApplyWindow(window_.get(),
                block_size_,
                num_input_channels_,
                input_block_.channels());
    callback_->ProcessBlock(input_block_.channels(),
                            block_size_,
                            num_input_channels_,
                            num_output_channels_,
                            output_block_.channels());
    ApplyWindow(window_.get(),
                block_size_,
                num_output_channels_,
                output_block_.channels());

    AddFrames(output_buffer_.channels(),
              first_frame_in_block,
              output_block_.channels(),
              0,
              block_size_,
              num_output_channels_,
              output_buffer_.channels(),
              first_frame_in_block);

    first_frame_in_block += shift_amount_;
  }

  // Copy output buffer to output
  CopyFrames(output_buffer_.channels(),
             0,
             chunk_size_,
             num_output_channels_,
             output,
             0);

  // Copy output buffer [chunk_size_, chunk_size_ + initial_delay]
  // to output buffer [0, initial_delay], zero the rest.
  MoveFrames(output_buffer_.channels(),
             chunk_size,
             initial_delay_,
             num_output_channels_,
             output_buffer_.channels(),
             0);
  ZeroOut(output_buffer_.channels(),
          initial_delay_,
          chunk_size_,
          num_output_channels_);

  // Calculate new starting frames.
  frame_offset_ = first_frame_in_block - chunk_size_;
}